

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_context.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::Context::InitializeFieldGeneratorInfoForFields
          (Context *this,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields)

{
  pointer pcVar1;
  byte bVar2;
  undefined8 uVar3;
  java *pjVar4;
  string *psVar5;
  int iVar6;
  pointer ppFVar7;
  ulong uVar8;
  long *plVar9;
  undefined8 *puVar10;
  LogMessage *pLVar11;
  pointer ppFVar12;
  char *pcVar13;
  mapped_type *pmVar14;
  java *pjVar15;
  long *plVar16;
  size_type *psVar17;
  ulong *puVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  ulong *puVar20;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *pFVar21;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *extraout_RDX_05;
  FieldDescriptor *extraout_RDX_06;
  FieldDescriptor *extraout_RDX_07;
  FieldDescriptor *extraout_RDX_08;
  FieldDescriptor *pFVar22;
  FieldDescriptor *extraout_RDX_09;
  FieldDescriptor *extraout_RDX_10;
  FieldDescriptor *extraout_RDX_11;
  FieldDescriptor *extraout_RDX_12;
  FieldDescriptor *extraout_RDX_13;
  FieldDescriptor *extraout_RDX_14;
  string *psVar23;
  string *psVar24;
  java *this_00;
  difference_type __n;
  ulong uVar25;
  ulong uVar26;
  bool bVar27;
  FieldDescriptor *field;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  conflict_reason;
  long *local_250;
  long local_248;
  long local_240;
  long lStack_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string local_210;
  undefined1 local_1e0 [32];
  char *local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 *local_1a0;
  undefined8 local_198;
  undefined1 local_190 [16];
  long *local_180;
  long local_178;
  long local_170;
  long lStack_168;
  long *local_160;
  long local_158;
  long local_150;
  long lStack_148;
  long *local_140;
  long local_138;
  long local_130;
  long lStack_128;
  FieldDescriptor *local_120;
  ulong local_118;
  FieldDescriptor *local_110;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *local_108;
  java *local_100;
  Context *local_f8;
  pointer local_f0;
  long local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  ulong local_a8;
  FieldDescriptor *local_a0;
  string local_98;
  string local_78;
  vector<bool,_std::allocator<bool>_> local_58;
  
  local_1e0._0_8_ = local_1e0._0_8_ & 0xffffffffffffff00;
  local_f8 = this;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,
             (long)(fields->
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(fields->
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3,(bool *)local_1e0,
             (allocator_type *)&local_210);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_e0,
           (long)(fields->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(fields->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)local_1e0);
  ppFVar12 = (fields->
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppFVar7 = (fields->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  pFVar22 = extraout_RDX;
  local_108 = fields;
  if (ppFVar7 != ppFVar12) {
    uVar25 = 1;
    pFVar21 = (FieldDescriptor *)0x0;
    do {
      local_100 = (java *)ppFVar12[(long)pFVar21];
      UnderscoresToCapitalizedCamelCase_abi_cxx11_(&local_78,local_100,pFVar22);
      local_a0 = pFVar21 + 1;
      ppFVar7 = (fields->
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      local_110 = pFVar21;
      if (local_a0 <
          (FieldDescriptor *)
          ((long)(fields->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar7 >> 3)) {
        local_118 = (ulong)pFVar21 >> 6;
        pFVar21 = (FieldDescriptor *)(1L << ((byte)pFVar21 & 0x3f));
        local_120 = pFVar21;
        local_a8 = uVar25;
        do {
          puVar20 = (ulong *)(local_1e0 + 0x10);
          this_00 = (java *)ppFVar7[uVar25];
          UnderscoresToCapitalizedCamelCase_abi_cxx11_(&local_98,this_00,pFVar21);
          if ((local_78._M_string_length == local_98._M_string_length) &&
             ((local_78._M_string_length == 0 ||
              (iVar6 = bcmp(local_78._M_dataplus._M_p,local_98._M_dataplus._M_p,
                            local_78._M_string_length), iVar6 == 0)))) {
            local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[uVar25 >> 6 & 0x3ffffff] =
                 local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [uVar25 >> 6 & 0x3ffffff] | 1L << ((byte)uVar25 & 0x3f);
            local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[local_118] =
                 local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[local_118] |
                 (ulong)local_120;
            std::operator+(&local_230,"capitalized name of field \"",
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            (local_100 + 8));
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_230);
            local_250 = &local_240;
            plVar16 = plVar9 + 2;
            if ((long *)*plVar9 == plVar16) {
              local_240 = *plVar16;
              lStack_238 = plVar9[3];
            }
            else {
              local_240 = *plVar16;
              local_250 = (long *)*plVar9;
            }
            local_248 = plVar9[1];
            *plVar9 = (long)plVar16;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_250,**(ulong **)(this_00 + 8));
            local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
            psVar17 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar17) {
              local_210.field_2._M_allocated_capacity = *psVar17;
              local_210.field_2._8_8_ = plVar9[3];
            }
            else {
              local_210.field_2._M_allocated_capacity = *psVar17;
              local_210._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_210._M_string_length = plVar9[1];
            *plVar9 = (long)psVar17;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_210);
            puVar18 = (ulong *)(plVar9 + 2);
            if ((ulong *)*plVar9 == puVar18) {
              local_1e0._16_8_ = *puVar18;
              local_1e0._24_8_ = plVar9[3];
              local_1e0._0_8_ = puVar20;
            }
            else {
              local_1e0._16_8_ = *puVar18;
              local_1e0._0_8_ = (ulong *)*plVar9;
            }
            local_1e0._8_8_ = plVar9[1];
            *plVar9 = (long)puVar18;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::__cxx11::string::operator=
                      ((string *)
                       (local_e0.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar25),(string *)local_1e0);
            std::__cxx11::string::_M_assign
                      ((string *)
                       (local_e0.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (long)local_110));
            pFVar21 = extraout_RDX_00;
            if ((ulong *)local_1e0._0_8_ != puVar20) {
              operator_delete((void *)local_1e0._0_8_);
              pFVar21 = extraout_RDX_01;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210._M_dataplus._M_p != &local_210.field_2) {
              operator_delete(local_210._M_dataplus._M_p);
              pFVar21 = extraout_RDX_02;
            }
            if (local_250 != &local_240) {
              operator_delete(local_250);
              pFVar21 = extraout_RDX_03;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p != &local_230.field_2) {
              operator_delete(local_230._M_dataplus._M_p);
              pFVar21 = extraout_RDX_04;
            }
          }
          else {
            local_e8 = uVar25 * 0x20;
            local_f0 = local_e0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar25;
            uVar8 = CONCAT71((int7)((ulong)local_e8 >> 8),local_100[1]);
            pjVar4 = local_100;
            psVar5 = &local_98;
            psVar24 = &local_78;
            do {
              psVar23 = psVar5;
              pjVar15 = pjVar4;
              bVar2 = (byte)uVar8;
              uVar8 = CONCAT71((int7)(uVar8 >> 8),this_00[1]);
              pFVar21 = (FieldDescriptor *)(uVar8 & 0xffffff60);
              if ((~bVar2 & 0x60) == 0) {
                if ((char)pFVar21 == '`') break;
                pcVar1 = (psVar24->_M_dataplus)._M_p;
                local_1e0._0_8_ = puVar20;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_1e0,pcVar1,pcVar1 + psVar24->_M_string_length);
                std::__cxx11::string::append(local_1e0);
                uVar3 = local_1e0._0_8_;
                if ((FieldDescriptor *)local_1e0._8_8_ ==
                    (FieldDescriptor *)psVar23->_M_string_length) {
                  if ((FieldDescriptor *)local_1e0._8_8_ == (FieldDescriptor *)0x0) {
                    bVar27 = true;
                  }
                  else {
                    iVar6 = bcmp((void *)local_1e0._0_8_,(psVar23->_M_dataplus)._M_p,local_1e0._8_8_
                                );
                    bVar27 = iVar6 == 0;
                  }
                }
                else {
                  bVar27 = false;
                }
                if ((undefined1 *)uVar3 != local_1e0 + 0x10) {
                  operator_delete((void *)uVar3);
                }
                if (bVar27) {
                  std::operator+(&local_c8,"both repeated field \"",
                                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   **)(pjVar15 + 8));
                  plVar9 = (long *)std::__cxx11::string::append((char *)&local_c8);
                  local_180 = &local_170;
                  plVar16 = plVar9 + 2;
                  if ((long *)*plVar9 == plVar16) {
                    local_170 = *plVar16;
                    lStack_168 = plVar9[3];
                  }
                  else {
                    local_170 = *plVar16;
                    local_180 = (long *)*plVar9;
                  }
                  local_178 = plVar9[1];
                  *plVar9 = (long)plVar16;
                  plVar9[1] = 0;
                  *(undefined1 *)(plVar9 + 2) = 0;
                  plVar9 = (long *)std::__cxx11::string::append((char *)&local_180);
                  local_160 = &local_150;
                  plVar16 = plVar9 + 2;
                  if ((long *)*plVar9 == plVar16) {
                    local_150 = *plVar16;
                    lStack_148 = plVar9[3];
                  }
                  else {
                    local_150 = *plVar16;
                    local_160 = (long *)*plVar9;
                  }
                  local_158 = plVar9[1];
                  *plVar9 = (long)plVar16;
                  plVar9[1] = 0;
                  *(undefined1 *)(plVar9 + 2) = 0;
                  plVar9 = (long *)std::__cxx11::string::_M_append
                                             ((char *)&local_160,**(ulong **)(this_00 + 8));
                  local_140 = &local_130;
                  plVar16 = plVar9 + 2;
                  if ((long *)*plVar9 == plVar16) {
                    local_130 = *plVar16;
                    lStack_128 = plVar9[3];
                  }
                  else {
                    local_130 = *plVar16;
                    local_140 = (long *)*plVar9;
                  }
                  local_138 = plVar9[1];
                  *plVar9 = (long)plVar16;
                  plVar9[1] = 0;
                  *(undefined1 *)(plVar9 + 2) = 0;
                  plVar9 = (long *)std::__cxx11::string::append((char *)&local_140);
                  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
                  paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(plVar9 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar9 == paVar19) {
                    local_230.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
                    local_230.field_2._8_8_ = plVar9[3];
                  }
                  else {
                    local_230.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
                    local_230._M_dataplus._M_p = (pointer)*plVar9;
                  }
                  local_230._M_string_length = plVar9[1];
                  *plVar9 = (long)paVar19;
                  plVar9[1] = 0;
                  *(undefined1 *)(plVar9 + 2) = 0;
                  puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_230);
                  local_250 = &local_240;
                  plVar9 = puVar10 + 2;
                  if ((long *)*puVar10 == plVar9) {
                    local_240 = *plVar9;
                    lStack_238 = puVar10[3];
                  }
                  else {
                    local_240 = *plVar9;
                    local_250 = (long *)*puVar10;
                  }
                  local_248 = puVar10[1];
                  *puVar10 = plVar9;
                  puVar10[1] = 0;
                  *(undefined1 *)(puVar10 + 2) = 0;
                  puVar10 = (undefined8 *)
                            std::__cxx11::string::_M_append
                                      ((char *)&local_250,(ulong)(psVar24->_M_dataplus)._M_p);
                  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
                  psVar17 = puVar10 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar10 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar17) {
                    local_210.field_2._M_allocated_capacity = *psVar17;
                    local_210.field_2._8_8_ = puVar10[3];
                  }
                  else {
                    local_210.field_2._M_allocated_capacity = *psVar17;
                    local_210._M_dataplus._M_p = (pointer)*puVar10;
                  }
                  local_210._M_string_length = puVar10[1];
                  *puVar10 = psVar17;
                  puVar10[1] = 0;
                  *(undefined1 *)(puVar10 + 2) = 0;
                  puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_210);
                }
                else {
                  local_1e0._0_8_ = local_1e0 + 0x10;
                  pcVar1 = (psVar24->_M_dataplus)._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_1e0,pcVar1,pcVar1 + psVar24->_M_string_length);
                  std::__cxx11::string::append(local_1e0);
                  uVar3 = local_1e0._0_8_;
                  pFVar21 = (FieldDescriptor *)local_1e0._8_8_;
                  if ((FieldDescriptor *)local_1e0._8_8_ ==
                      (FieldDescriptor *)psVar23->_M_string_length) {
                    if ((FieldDescriptor *)local_1e0._8_8_ == (FieldDescriptor *)0x0) {
                      bVar27 = true;
                    }
                    else {
                      iVar6 = bcmp((void *)local_1e0._0_8_,(psVar23->_M_dataplus)._M_p,
                                   local_1e0._8_8_);
                      bVar27 = iVar6 == 0;
                      pFVar21 = extraout_RDX_05;
                    }
                  }
                  else {
                    bVar27 = false;
                  }
                  if ((undefined1 *)uVar3 != local_1e0 + 0x10) {
                    operator_delete((void *)uVar3);
                    pFVar21 = extraout_RDX_06;
                  }
                  if (!bVar27) break;
                  std::operator+(&local_c8,"both repeated field \"",
                                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   **)(pjVar15 + 8));
                  puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
                  local_180 = &local_170;
                  plVar9 = puVar10 + 2;
                  if ((long *)*puVar10 == plVar9) {
                    local_170 = *plVar9;
                    lStack_168 = puVar10[3];
                  }
                  else {
                    local_170 = *plVar9;
                    local_180 = (long *)*puVar10;
                  }
                  local_178 = puVar10[1];
                  *puVar10 = plVar9;
                  puVar10[1] = 0;
                  *(undefined1 *)(puVar10 + 2) = 0;
                  puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_180);
                  local_160 = &local_150;
                  plVar9 = puVar10 + 2;
                  if ((long *)*puVar10 == plVar9) {
                    local_150 = *plVar9;
                    lStack_148 = puVar10[3];
                  }
                  else {
                    local_150 = *plVar9;
                    local_160 = (long *)*puVar10;
                  }
                  local_158 = puVar10[1];
                  *puVar10 = plVar9;
                  puVar10[1] = 0;
                  *(undefined1 *)(puVar10 + 2) = 0;
                  puVar10 = (undefined8 *)
                            std::__cxx11::string::_M_append
                                      ((char *)&local_160,**(ulong **)(this_00 + 8));
                  local_140 = &local_130;
                  plVar9 = puVar10 + 2;
                  if ((long *)*puVar10 == plVar9) {
                    local_130 = *plVar9;
                    lStack_128 = puVar10[3];
                  }
                  else {
                    local_130 = *plVar9;
                    local_140 = (long *)*puVar10;
                  }
                  local_138 = puVar10[1];
                  *puVar10 = plVar9;
                  puVar10[1] = 0;
                  *(undefined1 *)(puVar10 + 2) = 0;
                  puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_140);
                  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
                  paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(puVar10 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar10 == paVar19) {
                    local_230.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
                    local_230.field_2._8_8_ = puVar10[3];
                  }
                  else {
                    local_230.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
                    local_230._M_dataplus._M_p = (pointer)*puVar10;
                  }
                  local_230._M_string_length = puVar10[1];
                  *puVar10 = paVar19;
                  puVar10[1] = 0;
                  *(undefined1 *)(puVar10 + 2) = 0;
                  puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_230);
                  local_250 = &local_240;
                  plVar9 = puVar10 + 2;
                  if ((long *)*puVar10 == plVar9) {
                    local_240 = *plVar9;
                    lStack_238 = puVar10[3];
                  }
                  else {
                    local_240 = *plVar9;
                    local_250 = (long *)*puVar10;
                  }
                  local_248 = puVar10[1];
                  *puVar10 = plVar9;
                  puVar10[1] = 0;
                  *(undefined1 *)(puVar10 + 2) = 0;
                  puVar10 = (undefined8 *)
                            std::__cxx11::string::_M_append
                                      ((char *)&local_250,(ulong)(psVar24->_M_dataplus)._M_p);
                  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
                  psVar17 = puVar10 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar10 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar17) {
                    local_210.field_2._M_allocated_capacity = *psVar17;
                    local_210.field_2._8_8_ = puVar10[3];
                  }
                  else {
                    local_210.field_2._M_allocated_capacity = *psVar17;
                    local_210._M_dataplus._M_p = (pointer)*puVar10;
                  }
                  local_210._M_string_length = puVar10[1];
                  *puVar10 = psVar17;
                  puVar10[1] = 0;
                  *(undefined1 *)(puVar10 + 2) = 0;
                  puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_210);
                }
                puVar20 = puVar10 + 2;
                if ((ulong *)*puVar10 == puVar20) {
                  local_1e0._16_8_ = *puVar20;
                  local_1e0._24_8_ = puVar10[3];
                  local_1e0._0_8_ = local_1e0 + 0x10;
                }
                else {
                  local_1e0._16_8_ = *puVar20;
                  local_1e0._0_8_ = (ulong *)*puVar10;
                }
                local_1e0._8_8_ = puVar10[1];
                *puVar10 = puVar20;
                puVar10[1] = 0;
                *(undefined1 *)(puVar10 + 2) = 0;
                std::__cxx11::string::operator=((string *)local_f0,(string *)local_1e0);
                if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
                  operator_delete((void *)local_1e0._0_8_);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_210._M_dataplus._M_p != &local_210.field_2) {
                  operator_delete(local_210._M_dataplus._M_p);
                }
                if (local_250 != &local_240) {
                  operator_delete(local_250);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_230._M_dataplus._M_p != &local_230.field_2) {
                  operator_delete(local_230._M_dataplus._M_p);
                }
                if (local_140 != &local_130) {
                  operator_delete(local_140);
                }
                if (local_160 != &local_150) {
                  operator_delete(local_160);
                }
                if (local_180 != &local_170) {
                  operator_delete(local_180);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                  operator_delete(local_c8._M_dataplus._M_p);
                }
                local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p[uVar25 >> 6] =
                     local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar25 >> 6] |
                     1L << ((byte)uVar25 & 0x3f);
                local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p[local_118] =
                     local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[local_118] |
                     (ulong)local_120;
                std::__cxx11::string::_M_assign
                          ((string *)
                           (local_e0.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + (long)local_110));
                pFVar21 = extraout_RDX_07;
                break;
              }
              pjVar4 = this_00;
              psVar5 = psVar24;
              psVar24 = psVar23;
              this_00 = pjVar15;
            } while ((char)pFVar21 == '`');
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p);
            pFVar21 = extraout_RDX_08;
          }
          uVar25 = uVar25 + 1;
          ppFVar7 = (local_108->
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pFVar22 = local_120;
          uVar8 = local_118;
          fields = local_108;
          uVar26 = local_a8;
        } while (uVar25 < (ulong)((long)(local_108->
                                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar7
                                 >> 3));
      }
      else {
        pFVar22 = (FieldDescriptor *)(1L << ((byte)pFVar21 & 0x3f));
        uVar8 = (ulong)pFVar21 >> 6;
        uVar26 = uVar25;
      }
      if ((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar8] & (ulong)pFVar22) != 0) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_1e0,LOGLEVEL_WARNING,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_context.cc"
                   ,0x96);
        pLVar11 = internal::LogMessage::operator<<((LogMessage *)local_1e0,"field \"");
        pLVar11 = internal::LogMessage::operator<<
                            (pLVar11,(string *)(*(long *)(local_100 + 8) + 0x20));
        pLVar11 = internal::LogMessage::operator<<(pLVar11,"\" is conflicting ");
        pLVar11 = internal::LogMessage::operator<<(pLVar11,"with another field: ");
        pLVar11 = internal::LogMessage::operator<<
                            (pLVar11,local_e0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + (long)local_110);
        internal::LogFinisher::operator=((LogFinisher *)&local_210,pLVar11);
        internal::LogMessage::~LogMessage((LogMessage *)local_1e0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      ppFVar12 = (fields->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      ppFVar7 = (fields->
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      pFVar22 = (FieldDescriptor *)((long)ppFVar7 - (long)ppFVar12 >> 3);
      uVar25 = uVar26 + 1;
      pFVar21 = local_a0;
    } while (local_a0 < pFVar22);
  }
  if (ppFVar7 != ppFVar12) {
    paVar19 = &local_210.field_2;
    local_f8 = (Context *)&local_f8->field_generator_info_map_;
    uVar25 = 0;
    do {
      local_230._M_dataplus._M_p = (pointer)ppFVar12[uVar25];
      local_1e0._0_8_ = local_1e0 + 0x10;
      local_1e0._8_8_ = (FieldDescriptor *)0x0;
      local_1e0._16_8_ = local_1e0._16_8_ & 0xffffffffffffff00;
      local_1c0 = local_1b8._M_local_buf + 8;
      local_1b8._M_allocated_capacity = 0;
      local_1b8._M_local_buf[8] = '\0';
      local_1a0 = local_190;
      local_198 = 0;
      local_190[0] = 0;
      CamelCaseFieldName_abi_cxx11_(&local_210,(java *)local_230._M_dataplus._M_p,pFVar22);
      std::__cxx11::string::operator=((string *)local_1e0,(string *)&local_210);
      pFVar22 = extraout_RDX_09;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar19) {
        operator_delete(local_210._M_dataplus._M_p);
        pFVar22 = extraout_RDX_10;
      }
      UnderscoresToCapitalizedCamelCase_abi_cxx11_
                (&local_210,(java *)local_230._M_dataplus._M_p,pFVar22);
      std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_210);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar19) {
        operator_delete(local_210._M_dataplus._M_p);
      }
      if ((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar25 >> 6 & 0x3ffffff] >> (uVar25 & 0x3f) & 1)
          != 0) {
        local_210._M_dataplus._M_p = (pointer)paVar19;
        pcVar13 = FastInt32ToBufferLeft
                            (*(int32 *)(local_230._M_dataplus._M_p + 4),paVar19->_M_local_buf);
        local_210._M_string_length = (long)pcVar13 - (long)paVar19;
        local_250 = &local_240;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_250,local_210._M_dataplus._M_p,
                   local_210._M_dataplus._M_p + local_210._M_string_length);
        std::__cxx11::string::_M_append(local_1e0,(ulong)local_250);
        if (local_250 != &local_240) {
          operator_delete(local_250);
        }
        local_210._M_dataplus._M_p = (pointer)paVar19;
        pcVar13 = FastInt32ToBufferLeft
                            (*(int32 *)(local_230._M_dataplus._M_p + 4),paVar19->_M_local_buf);
        local_210._M_string_length = (long)pcVar13 - (long)paVar19;
        local_250 = &local_240;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_250,local_210._M_dataplus._M_p,
                   local_210._M_dataplus._M_p + local_210._M_string_length);
        std::__cxx11::string::_M_append((char *)&local_1c0,(ulong)local_250);
        if (local_250 != &local_240) {
          operator_delete(local_250);
        }
        std::__cxx11::string::_M_assign((string *)&local_1a0);
      }
      pmVar14 = std::
                map<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::FieldGeneratorInfo,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::compiler::java::FieldGeneratorInfo>_>_>
                ::operator[]((map<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::FieldGeneratorInfo,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::compiler::java::FieldGeneratorInfo>_>_>
                              *)local_f8,(key_type *)&local_230);
      std::__cxx11::string::_M_assign((string *)pmVar14);
      std::__cxx11::string::_M_assign((string *)&pmVar14->capitalized_name);
      std::__cxx11::string::_M_assign((string *)&pmVar14->disambiguated_reason);
      pFVar22 = extraout_RDX_11;
      if (local_1a0 != local_190) {
        operator_delete(local_1a0);
        pFVar22 = extraout_RDX_12;
      }
      if (local_1c0 != local_1b8._M_local_buf + 8) {
        operator_delete(local_1c0);
        pFVar22 = extraout_RDX_13;
      }
      if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
        operator_delete((void *)local_1e0._0_8_);
        pFVar22 = extraout_RDX_14;
      }
      uVar25 = uVar25 + 1;
      ppFVar12 = (local_108->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar25 < (ulong)((long)(local_108->
                                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar12 >>
                             3));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e0);
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void Context::InitializeFieldGeneratorInfoForFields(
    const std::vector<const FieldDescriptor*>& fields) {
  // Find out all fields that conflict with some other field in the same
  // message.
  std::vector<bool> is_conflict(fields.size());
  std::vector<std::string> conflict_reason(fields.size());
  for (int i = 0; i < fields.size(); ++i) {
    const FieldDescriptor* field = fields[i];
    const std::string& name = UnderscoresToCapitalizedCamelCase(field);
    for (int j = i + 1; j < fields.size(); ++j) {
      const FieldDescriptor* other = fields[j];
      const std::string& other_name = UnderscoresToCapitalizedCamelCase(other);
      if (name == other_name) {
        is_conflict[i] = is_conflict[j] = true;
        conflict_reason[i] = conflict_reason[j] =
            "capitalized name of field \"" + field->name() +
            "\" conflicts with field \"" + other->name() + "\"";
      } else if (IsConflicting(field, name, other, other_name,
                               &conflict_reason[j])) {
        is_conflict[i] = is_conflict[j] = true;
        conflict_reason[i] = conflict_reason[j];
      }
    }
    if (is_conflict[i]) {
      GOOGLE_LOG(WARNING) << "field \"" << field->full_name() << "\" is conflicting "
                   << "with another field: " << conflict_reason[i];
    }
  }
  for (int i = 0; i < fields.size(); ++i) {
    const FieldDescriptor* field = fields[i];
    FieldGeneratorInfo info;
    info.name = CamelCaseFieldName(field);
    info.capitalized_name = UnderscoresToCapitalizedCamelCase(field);
    // For fields conflicting with some other fields, we append the field
    // number to their field names in generated code to avoid conflicts.
    if (is_conflict[i]) {
      info.name += StrCat(field->number());
      info.capitalized_name += StrCat(field->number());
      info.disambiguated_reason = conflict_reason[i];
    }
    field_generator_info_map_[field] = info;
  }
}